

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O3

bool __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcAnimTy,_(XPMP2::RemoteMsgTy)5,_(unsigned_char)'\x00'>::add
          (RmtMsgBufTy<XPMP2::RemoteAcAnimTy,_(XPMP2::RemoteMsgTy)5,_(unsigned_char)__x00_> *this,
          RemoteAcAnimTy *_elem)

{
  ulong __n;
  ulong uVar1;
  
  if (this->pMsg == (void *)0x0) {
    init(this,(EVP_PKEY_CTX *)_elem);
  }
  __n = (ulong)_elem->numVals * 2 + 6;
  uVar1 = DAT_002ec768 - this->size;
  if (__n <= uVar1) {
    memcpy((void *)(this->size + (long)this->pMsg),_elem,__n);
    this->elemCount = this->elemCount + 1;
    this->size = __n + this->size;
  }
  return __n <= uVar1;
}

Assistant:

bool RmtMsgBufTy<ElemTy,MsgTy,msgVer>::add (const ElemTy& _elem)
{
    // no buffer defined yet? -> do so!
    if (!pMsg) init();
        
    // no space left?
    const size_t elemSize = _elem.msgSize();
    if (glob.remoteBufSize - size < elemSize)
        return false;
    
    // Copy the element into the msg buffer
    memcpy(reinterpret_cast<char*>(pMsg) + size, &_elem, elemSize);
    ++elemCount;
    size += elemSize;
    return true;
}